

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O2

unsigned_short
beast::lexicalCast<unsigned_short,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in,
          unsigned_short defaultValue)

{
  bool bVar1;
  unsigned_short out;
  unsigned_short local_3a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)in);
  bVar1 = lexicalCastChecked<unsigned_short,std::__cxx11::string>(&local_3a,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    defaultValue = local_3a;
  }
  return defaultValue;
}

Assistant:

Out lexicalCast (In in, Out defaultValue = Out ())
{
    Out out;

    if (lexicalCastChecked (out, in))
        return out;

    return defaultValue;
}